

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_1x1_pack8_fp16.h
# Opt level: O2

void ncnn::conv1x1s1_sgemm_transform_kernel_fp16_pack8_avx
               (Mat *kernel,Mat *weight_data_pack8,int num_input,int num_output)

{
  long lVar1;
  long lVar2;
  void *pvVar3;
  void *pvVar4;
  void *pvVar5;
  void *pvVar6;
  void *pvVar7;
  void *pvVar8;
  void *pvVar9;
  void *pvVar10;
  unsigned_short uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  uint _c;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  unsigned_short *puVar23;
  Mat g0;
  Mat k7;
  Mat k6;
  Mat k5;
  Mat k4;
  Mat k3;
  Mat k2;
  Mat k1;
  Mat k0;
  Mat weight_data_r2;
  
  uVar22 = 0;
  Mat::reshape(&weight_data_r2,kernel,1,num_input,num_output,(Allocator *)0x0);
  Mat::create(weight_data_pack8,1,num_input / 8,num_output / 8,0x80,0x40,(Allocator *)0x0);
  while( true ) {
    _c = (uint)uVar22;
    if (num_output <= (int)(_c | 7)) break;
    Mat::channel(&k0,&weight_data_r2,_c);
    Mat::channel(&k1,&weight_data_r2,_c | 1);
    Mat::channel(&k2,&weight_data_r2,_c | 2);
    Mat::channel(&k3,&weight_data_r2,_c | 3);
    Mat::channel(&k4,&weight_data_r2,_c | 4);
    Mat::channel(&k5,&weight_data_r2,_c | 5);
    Mat::channel(&k6,&weight_data_r2,_c | 6);
    Mat::channel(&k7,&weight_data_r2,_c | 7);
    Mat::channel(&g0,weight_data_pack8,(int)(uVar22 >> 3));
    lVar12 = 0;
    for (lVar17 = 0; pvVar10 = k0.data, pvVar9 = k1.data, pvVar8 = k2.data, pvVar7 = k3.data,
        pvVar6 = k4.data, pvVar5 = k5.data, pvVar4 = k6.data, pvVar3 = k7.data, lVar1 = lVar17 + 7,
        lVar1 < num_input; lVar17 = lVar17 + 8) {
      lVar18 = (long)k0.w * k0.elemsize;
      lVar19 = (long)k1.w * k1.elemsize;
      lVar20 = (long)k2.w * k2.elemsize;
      lVar21 = (long)k3.w * k3.elemsize;
      lVar13 = (long)k4.w * k4.elemsize;
      lVar14 = (long)k5.w * k5.elemsize;
      lVar15 = (long)k6.w * k6.elemsize;
      lVar16 = (long)k7.w * k7.elemsize;
      puVar23 = (unsigned_short *)(g0.w * lVar12 * g0.elemsize + (long)g0.data);
      uVar11 = float32_to_float16(*(float *)((long)k0.data + lVar18 * lVar17));
      *puVar23 = uVar11;
      uVar11 = float32_to_float16(*(float *)((long)pvVar9 + lVar19 * lVar17));
      puVar23[1] = uVar11;
      uVar11 = float32_to_float16(*(float *)((long)pvVar8 + lVar20 * lVar17));
      puVar23[2] = uVar11;
      uVar11 = float32_to_float16(*(float *)((long)pvVar7 + lVar21 * lVar17));
      puVar23[3] = uVar11;
      uVar11 = float32_to_float16(*(float *)((long)pvVar6 + lVar13 * lVar17));
      puVar23[4] = uVar11;
      uVar11 = float32_to_float16(*(float *)((long)pvVar5 + lVar14 * lVar17));
      puVar23[5] = uVar11;
      uVar11 = float32_to_float16(*(float *)((long)pvVar4 + lVar15 * lVar17));
      puVar23[6] = uVar11;
      uVar11 = float32_to_float16(*(float *)((long)pvVar3 + lVar16 * lVar17));
      lVar2 = lVar17 + 1;
      puVar23[7] = uVar11;
      uVar11 = float32_to_float16(*(float *)((long)pvVar10 + lVar18 * lVar2));
      puVar23[8] = uVar11;
      uVar11 = float32_to_float16(*(float *)((long)pvVar9 + lVar19 * lVar2));
      puVar23[9] = uVar11;
      uVar11 = float32_to_float16(*(float *)((long)pvVar8 + lVar20 * lVar2));
      puVar23[10] = uVar11;
      uVar11 = float32_to_float16(*(float *)((long)pvVar7 + lVar21 * lVar2));
      puVar23[0xb] = uVar11;
      uVar11 = float32_to_float16(*(float *)((long)pvVar6 + lVar13 * lVar2));
      puVar23[0xc] = uVar11;
      uVar11 = float32_to_float16(*(float *)((long)pvVar5 + lVar14 * lVar2));
      puVar23[0xd] = uVar11;
      uVar11 = float32_to_float16(*(float *)((long)pvVar4 + lVar15 * lVar2));
      puVar23[0xe] = uVar11;
      uVar11 = float32_to_float16(*(float *)((long)pvVar3 + lVar2 * lVar16));
      lVar2 = lVar17 + 2;
      puVar23[0xf] = uVar11;
      uVar11 = float32_to_float16(*(float *)((long)pvVar10 + lVar18 * lVar2));
      puVar23[0x10] = uVar11;
      uVar11 = float32_to_float16(*(float *)((long)pvVar9 + lVar19 * lVar2));
      puVar23[0x11] = uVar11;
      uVar11 = float32_to_float16(*(float *)((long)pvVar8 + lVar20 * lVar2));
      puVar23[0x12] = uVar11;
      uVar11 = float32_to_float16(*(float *)((long)pvVar7 + lVar21 * lVar2));
      puVar23[0x13] = uVar11;
      uVar11 = float32_to_float16(*(float *)((long)pvVar6 + lVar13 * lVar2));
      puVar23[0x14] = uVar11;
      uVar11 = float32_to_float16(*(float *)((long)pvVar5 + lVar14 * lVar2));
      puVar23[0x15] = uVar11;
      uVar11 = float32_to_float16(*(float *)((long)pvVar4 + lVar15 * lVar2));
      puVar23[0x16] = uVar11;
      uVar11 = float32_to_float16(*(float *)((long)pvVar3 + lVar2 * lVar16));
      lVar2 = lVar17 + 3;
      puVar23[0x17] = uVar11;
      uVar11 = float32_to_float16(*(float *)((long)pvVar10 + lVar18 * lVar2));
      puVar23[0x18] = uVar11;
      uVar11 = float32_to_float16(*(float *)((long)pvVar9 + lVar19 * lVar2));
      puVar23[0x19] = uVar11;
      uVar11 = float32_to_float16(*(float *)((long)pvVar8 + lVar20 * lVar2));
      puVar23[0x1a] = uVar11;
      uVar11 = float32_to_float16(*(float *)((long)pvVar7 + lVar21 * lVar2));
      puVar23[0x1b] = uVar11;
      uVar11 = float32_to_float16(*(float *)((long)pvVar6 + lVar13 * lVar2));
      puVar23[0x1c] = uVar11;
      uVar11 = float32_to_float16(*(float *)((long)pvVar5 + lVar14 * lVar2));
      puVar23[0x1d] = uVar11;
      uVar11 = float32_to_float16(*(float *)((long)pvVar4 + lVar15 * lVar2));
      puVar23[0x1e] = uVar11;
      uVar11 = float32_to_float16(*(float *)((long)pvVar3 + lVar2 * lVar16));
      lVar2 = lVar17 + 4;
      puVar23[0x1f] = uVar11;
      uVar11 = float32_to_float16(*(float *)((long)pvVar10 + lVar18 * lVar2));
      puVar23[0x20] = uVar11;
      uVar11 = float32_to_float16(*(float *)((long)pvVar9 + lVar19 * lVar2));
      puVar23[0x21] = uVar11;
      uVar11 = float32_to_float16(*(float *)((long)pvVar8 + lVar20 * lVar2));
      puVar23[0x22] = uVar11;
      uVar11 = float32_to_float16(*(float *)((long)pvVar7 + lVar21 * lVar2));
      puVar23[0x23] = uVar11;
      uVar11 = float32_to_float16(*(float *)((long)pvVar6 + lVar13 * lVar2));
      puVar23[0x24] = uVar11;
      uVar11 = float32_to_float16(*(float *)((long)pvVar5 + lVar14 * lVar2));
      puVar23[0x25] = uVar11;
      uVar11 = float32_to_float16(*(float *)((long)pvVar4 + lVar15 * lVar2));
      puVar23[0x26] = uVar11;
      uVar11 = float32_to_float16(*(float *)((long)pvVar3 + lVar2 * lVar16));
      lVar2 = lVar17 + 5;
      puVar23[0x27] = uVar11;
      uVar11 = float32_to_float16(*(float *)((long)pvVar10 + lVar18 * lVar2));
      puVar23[0x28] = uVar11;
      uVar11 = float32_to_float16(*(float *)((long)pvVar9 + lVar19 * lVar2));
      puVar23[0x29] = uVar11;
      uVar11 = float32_to_float16(*(float *)((long)pvVar8 + lVar20 * lVar2));
      puVar23[0x2a] = uVar11;
      uVar11 = float32_to_float16(*(float *)((long)pvVar7 + lVar21 * lVar2));
      puVar23[0x2b] = uVar11;
      uVar11 = float32_to_float16(*(float *)((long)pvVar6 + lVar13 * lVar2));
      puVar23[0x2c] = uVar11;
      uVar11 = float32_to_float16(*(float *)((long)pvVar5 + lVar14 * lVar2));
      puVar23[0x2d] = uVar11;
      uVar11 = float32_to_float16(*(float *)((long)pvVar4 + lVar15 * lVar2));
      puVar23[0x2e] = uVar11;
      uVar11 = float32_to_float16(*(float *)((long)pvVar3 + lVar2 * lVar16));
      lVar2 = lVar17 + 6;
      puVar23[0x2f] = uVar11;
      uVar11 = float32_to_float16(*(float *)((long)pvVar10 + lVar18 * lVar2));
      puVar23[0x30] = uVar11;
      uVar11 = float32_to_float16(*(float *)((long)pvVar9 + lVar19 * lVar2));
      puVar23[0x31] = uVar11;
      uVar11 = float32_to_float16(*(float *)((long)pvVar8 + lVar20 * lVar2));
      puVar23[0x32] = uVar11;
      uVar11 = float32_to_float16(*(float *)((long)pvVar7 + lVar21 * lVar2));
      puVar23[0x33] = uVar11;
      uVar11 = float32_to_float16(*(float *)((long)pvVar6 + lVar13 * lVar2));
      puVar23[0x34] = uVar11;
      uVar11 = float32_to_float16(*(float *)((long)pvVar5 + lVar14 * lVar2));
      puVar23[0x35] = uVar11;
      uVar11 = float32_to_float16(*(float *)((long)pvVar4 + lVar15 * lVar2));
      puVar23[0x36] = uVar11;
      uVar11 = float32_to_float16(*(float *)((long)pvVar3 + lVar2 * lVar16));
      puVar23[0x37] = uVar11;
      uVar11 = float32_to_float16(*(float *)((long)pvVar10 + lVar18 * lVar1));
      puVar23[0x38] = uVar11;
      uVar11 = float32_to_float16(*(float *)((long)pvVar9 + lVar19 * lVar1));
      puVar23[0x39] = uVar11;
      uVar11 = float32_to_float16(*(float *)((long)pvVar8 + lVar20 * lVar1));
      puVar23[0x3a] = uVar11;
      uVar11 = float32_to_float16(*(float *)((long)pvVar7 + lVar21 * lVar1));
      puVar23[0x3b] = uVar11;
      uVar11 = float32_to_float16(*(float *)((long)pvVar6 + lVar13 * lVar1));
      puVar23[0x3c] = uVar11;
      uVar11 = float32_to_float16(*(float *)((long)pvVar5 + lVar14 * lVar1));
      puVar23[0x3d] = uVar11;
      uVar11 = float32_to_float16(*(float *)((long)pvVar4 + lVar15 * lVar1));
      puVar23[0x3e] = uVar11;
      uVar11 = float32_to_float16(*(float *)((long)pvVar3 + lVar16 * lVar1));
      puVar23[0x3f] = uVar11;
      lVar12 = lVar12 + 1;
    }
    Mat::~Mat(&g0);
    Mat::~Mat(&k7);
    Mat::~Mat(&k6);
    Mat::~Mat(&k5);
    Mat::~Mat(&k4);
    Mat::~Mat(&k3);
    Mat::~Mat(&k2);
    Mat::~Mat(&k1);
    Mat::~Mat(&k0);
    uVar22 = (ulong)(_c + 8);
  }
  Mat::~Mat(&weight_data_r2);
  return;
}

Assistant:

static void conv1x1s1_sgemm_transform_kernel_fp16_pack8_avx(const Mat& kernel, Mat& weight_data_pack8, int num_input, int num_output)
{
    // src = kw-kh-inch-outch
    // dst = 8b-8a-kw-kh-inch/8a-outch/8b
    Mat weight_data_r2 = kernel.reshape(1, num_input, num_output);

    weight_data_pack8.create(1, num_input / 8, num_output / 8, (size_t)2 * 64, 64);

    for (int q = 0; q + 7 < num_output; q += 8)
    {
        const Mat k0 = weight_data_r2.channel(q);
        const Mat k1 = weight_data_r2.channel(q + 1);
        const Mat k2 = weight_data_r2.channel(q + 2);
        const Mat k3 = weight_data_r2.channel(q + 3);
        const Mat k4 = weight_data_r2.channel(q + 4);
        const Mat k5 = weight_data_r2.channel(q + 5);
        const Mat k6 = weight_data_r2.channel(q + 6);
        const Mat k7 = weight_data_r2.channel(q + 7);

        Mat g0 = weight_data_pack8.channel(q / 8);

        for (int p = 0; p + 7 < num_input; p += 8)
        {
            const float* k00 = k0.row(p);
            const float* k01 = k0.row(p + 1);
            const float* k02 = k0.row(p + 2);
            const float* k03 = k0.row(p + 3);
            const float* k04 = k0.row(p + 4);
            const float* k05 = k0.row(p + 5);
            const float* k06 = k0.row(p + 6);
            const float* k07 = k0.row(p + 7);

            const float* k10 = k1.row(p);
            const float* k11 = k1.row(p + 1);
            const float* k12 = k1.row(p + 2);
            const float* k13 = k1.row(p + 3);
            const float* k14 = k1.row(p + 4);
            const float* k15 = k1.row(p + 5);
            const float* k16 = k1.row(p + 6);
            const float* k17 = k1.row(p + 7);

            const float* k20 = k2.row(p);
            const float* k21 = k2.row(p + 1);
            const float* k22 = k2.row(p + 2);
            const float* k23 = k2.row(p + 3);
            const float* k24 = k2.row(p + 4);
            const float* k25 = k2.row(p + 5);
            const float* k26 = k2.row(p + 6);
            const float* k27 = k2.row(p + 7);

            const float* k30 = k3.row(p);
            const float* k31 = k3.row(p + 1);
            const float* k32 = k3.row(p + 2);
            const float* k33 = k3.row(p + 3);
            const float* k34 = k3.row(p + 4);
            const float* k35 = k3.row(p + 5);
            const float* k36 = k3.row(p + 6);
            const float* k37 = k3.row(p + 7);

            const float* k40 = k4.row(p);
            const float* k41 = k4.row(p + 1);
            const float* k42 = k4.row(p + 2);
            const float* k43 = k4.row(p + 3);
            const float* k44 = k4.row(p + 4);
            const float* k45 = k4.row(p + 5);
            const float* k46 = k4.row(p + 6);
            const float* k47 = k4.row(p + 7);

            const float* k50 = k5.row(p);
            const float* k51 = k5.row(p + 1);
            const float* k52 = k5.row(p + 2);
            const float* k53 = k5.row(p + 3);
            const float* k54 = k5.row(p + 4);
            const float* k55 = k5.row(p + 5);
            const float* k56 = k5.row(p + 6);
            const float* k57 = k5.row(p + 7);

            const float* k60 = k6.row(p);
            const float* k61 = k6.row(p + 1);
            const float* k62 = k6.row(p + 2);
            const float* k63 = k6.row(p + 3);
            const float* k64 = k6.row(p + 4);
            const float* k65 = k6.row(p + 5);
            const float* k66 = k6.row(p + 6);
            const float* k67 = k6.row(p + 7);

            const float* k70 = k7.row(p);
            const float* k71 = k7.row(p + 1);
            const float* k72 = k7.row(p + 2);
            const float* k73 = k7.row(p + 3);
            const float* k74 = k7.row(p + 4);
            const float* k75 = k7.row(p + 5);
            const float* k76 = k7.row(p + 6);
            const float* k77 = k7.row(p + 7);

            unsigned short* g00 = (unsigned short*)g0.row(p / 8);
            g00[0] = float32_to_float16(k00[0]);
            g00[1] = float32_to_float16(k10[0]);
            g00[2] = float32_to_float16(k20[0]);
            g00[3] = float32_to_float16(k30[0]);
            g00[4] = float32_to_float16(k40[0]);
            g00[5] = float32_to_float16(k50[0]);
            g00[6] = float32_to_float16(k60[0]);
            g00[7] = float32_to_float16(k70[0]);
            g00 += 8;
            g00[0] = float32_to_float16(k01[0]);
            g00[1] = float32_to_float16(k11[0]);
            g00[2] = float32_to_float16(k21[0]);
            g00[3] = float32_to_float16(k31[0]);
            g00[4] = float32_to_float16(k41[0]);
            g00[5] = float32_to_float16(k51[0]);
            g00[6] = float32_to_float16(k61[0]);
            g00[7] = float32_to_float16(k71[0]);

            g00 += 8;
            g00[0] = float32_to_float16(k02[0]);
            g00[1] = float32_to_float16(k12[0]);
            g00[2] = float32_to_float16(k22[0]);
            g00[3] = float32_to_float16(k32[0]);
            g00[4] = float32_to_float16(k42[0]);
            g00[5] = float32_to_float16(k52[0]);
            g00[6] = float32_to_float16(k62[0]);
            g00[7] = float32_to_float16(k72[0]);

            g00 += 8;
            g00[0] = float32_to_float16(k03[0]);
            g00[1] = float32_to_float16(k13[0]);
            g00[2] = float32_to_float16(k23[0]);
            g00[3] = float32_to_float16(k33[0]);
            g00[4] = float32_to_float16(k43[0]);
            g00[5] = float32_to_float16(k53[0]);
            g00[6] = float32_to_float16(k63[0]);
            g00[7] = float32_to_float16(k73[0]);

            g00 += 8;
            g00[0] = float32_to_float16(k04[0]);
            g00[1] = float32_to_float16(k14[0]);
            g00[2] = float32_to_float16(k24[0]);
            g00[3] = float32_to_float16(k34[0]);
            g00[4] = float32_to_float16(k44[0]);
            g00[5] = float32_to_float16(k54[0]);
            g00[6] = float32_to_float16(k64[0]);
            g00[7] = float32_to_float16(k74[0]);

            g00 += 8;
            g00[0] = float32_to_float16(k05[0]);
            g00[1] = float32_to_float16(k15[0]);
            g00[2] = float32_to_float16(k25[0]);
            g00[3] = float32_to_float16(k35[0]);
            g00[4] = float32_to_float16(k45[0]);
            g00[5] = float32_to_float16(k55[0]);
            g00[6] = float32_to_float16(k65[0]);
            g00[7] = float32_to_float16(k75[0]);

            g00 += 8;
            g00[0] = float32_to_float16(k06[0]);
            g00[1] = float32_to_float16(k16[0]);
            g00[2] = float32_to_float16(k26[0]);
            g00[3] = float32_to_float16(k36[0]);
            g00[4] = float32_to_float16(k46[0]);
            g00[5] = float32_to_float16(k56[0]);
            g00[6] = float32_to_float16(k66[0]);
            g00[7] = float32_to_float16(k76[0]);

            g00 += 8;
            g00[0] = float32_to_float16(k07[0]);
            g00[1] = float32_to_float16(k17[0]);
            g00[2] = float32_to_float16(k27[0]);
            g00[3] = float32_to_float16(k37[0]);
            g00[4] = float32_to_float16(k47[0]);
            g00[5] = float32_to_float16(k57[0]);
            g00[6] = float32_to_float16(k67[0]);
            g00[7] = float32_to_float16(k77[0]);

            g00 += 8;
        }
    }
}